

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::ExitLoop(ByteCodeWriter *this,uint loopId)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  
  bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(this->m_functionWrite);
  if (bVar3) {
    Unsigned1(this,ProfiledLoopEnd,loopId);
  }
  if (this->m_loopNest < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcba,"(m_loopNest > 0)","m_loopNest > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->m_loopNest = this->m_loopNest + -1;
  uVar1 = (this->m_byteCodeData).currentOffset;
  pTVar5 = JsUtil::
           List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this->m_loopHeaders,loopId);
  pTVar5->endOffset = uVar1;
  return;
}

Assistant:

void ByteCodeWriter::ExitLoop(uint loopId)
    {
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionWrite()))
        {
            this->Unsigned1(Js::OpCode::ProfiledLoopEnd, loopId);
        }
#endif
        Assert(m_loopNest > 0);
        m_loopNest--;
        m_loopHeaders->Item(loopId).endOffset = m_byteCodeData.GetCurrentOffset();
    }